

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenBrOn(BinaryenModuleRef module,BinaryenOp op,char *name,BinaryenExpressionRef ref,
            BinaryenType castType)

{
  BrOn *pBVar1;
  string_view local_48;
  Builder local_38;
  
  local_38.wasm = module;
  wasm::Name::Name((Name *)&local_48,name);
  pBVar1 = wasm::Builder::makeBrOn(&local_38,op,(Name)local_48,ref,(Type)castType);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBrOn(BinaryenModuleRef module,
                                   BinaryenOp op,
                                   const char* name,
                                   BinaryenExpressionRef ref,
                                   BinaryenType castType) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBrOn(BrOnOp(op), name, (Expression*)ref, Type(castType)));
}